

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int cmac_multiply_by_u(uchar *output,uchar *input,size_t blocksize)

{
  int local_34;
  byte local_2d;
  int i;
  uchar overflow;
  uchar mask;
  uchar R_n;
  uchar R_64;
  uchar R_128;
  size_t blocksize_local;
  uchar *input_local;
  uchar *output_local;
  
  local_2d = 0;
  if (blocksize == 0x10) {
    i._1_1_ = 0x87;
  }
  else {
    if (blocksize != 8) {
      return -0x6100;
    }
    i._1_1_ = 0x1b;
  }
  local_34 = (int)blocksize;
  while (local_34 = local_34 + -1, -1 < local_34) {
    output[local_34] = input[local_34] << 1 | local_2d;
    local_2d = (byte)((int)(uint)input[local_34] >> 7);
  }
  output[blocksize - 1] = output[blocksize - 1] ^ i._1_1_ & -(char)((int)(uint)*input >> 7);
  return 0;
}

Assistant:

static int cmac_multiply_by_u( unsigned char *output,
                               const unsigned char *input,
                               size_t blocksize )
{
    const unsigned char R_128 = 0x87;
    const unsigned char R_64 = 0x1B;
    unsigned char R_n, mask;
    unsigned char overflow = 0x00;
    int i;

    if( blocksize == MBEDTLS_AES_BLOCK_SIZE )
    {
        R_n = R_128;
    }
    else if( blocksize == MBEDTLS_DES3_BLOCK_SIZE )
    {
        R_n = R_64;
    }
    else
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    for( i = (int)blocksize - 1; i >= 0; i-- )
    {
        output[i] = input[i] << 1 | overflow;
        overflow = input[i] >> 7;
    }

    /* mask = ( input[0] >> 7 ) ? 0xff : 0x00
     * using bit operations to avoid branches */

    /* MSVC has a warning about unary minus on unsigned, but this is
     * well-defined and precisely what we want to do here */
#if defined(_MSC_VER)
#pragma warning( push )
#pragma warning( disable : 4146 )
#endif
    mask = - ( input[0] >> 7 );
#if defined(_MSC_VER)
#pragma warning( pop )
#endif

    output[ blocksize - 1 ] ^= R_n & mask;

    return( 0 );
}